

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O0

aspa_status
aspa_table_update_in_place_undo_internal
          (aspa_table *aspa_table,rtr_socket *rtr_socket,aspa_update_operation *operations,
          size_t count,aspa_update_operation *failed_operation)

{
  long lVar1;
  aspa_array *array_00;
  aspa_status aVar2;
  aspa_store_node **ppaVar3;
  aspa_update_operation *paVar4;
  aspa_record *paVar5;
  long in_FS_OFFSET;
  bool bVar6;
  bool bVar7;
  aspa_update_operation *local_88;
  _Bool next_matches_current;
  _Bool existing_matches_current;
  aspa_record *existing_record;
  aspa_update_operation *next;
  aspa_update_operation *current;
  size_t i;
  size_t existing_i;
  aspa_array *array;
  aspa_store_node **node;
  aspa_update_operation *failed_operation_local;
  size_t count_local;
  aspa_update_operation *operations_local;
  rtr_socket *rtr_socket_local;
  aspa_table *aspa_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x2fc,
                  "enum aspa_status aspa_table_update_in_place_undo_internal(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x2fd,
                  "enum aspa_status aspa_table_update_in_place_undo_internal(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  if (operations == (aspa_update_operation *)0x0) {
    __assert_fail("operations",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x2fe,
                  "enum aspa_status aspa_table_update_in_place_undo_internal(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  if (count == 0) {
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x2ff,
                  "enum aspa_status aspa_table_update_in_place_undo_internal(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
  ppaVar3 = aspa_store_get_node(&aspa_table->store,rtr_socket);
  if (((ppaVar3 == (aspa_store_node **)0x0) || (*ppaVar3 == (aspa_store_node *)0x0)) ||
     ((*ppaVar3)->aspa_array == (aspa_array *)0x0)) {
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    aspa_table_local._4_4_ = ASPA_ERROR;
  }
  else {
    if (ppaVar3 == (aspa_store_node **)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                    ,0x30a,
                    "enum aspa_status aspa_table_update_in_place_undo_internal(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                   );
    }
    if (*ppaVar3 == (aspa_store_node *)0x0) {
      __assert_fail("*node",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                    ,0x30b,
                    "enum aspa_status aspa_table_update_in_place_undo_internal(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                   );
    }
    if ((*ppaVar3)->aspa_array == (aspa_array *)0x0) {
      __assert_fail("(*node)->aspa_array",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                    ,0x30c,
                    "enum aspa_status aspa_table_update_in_place_undo_internal(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                   );
    }
    array_00 = (*ppaVar3)->aspa_array;
    i = 0;
    for (current = (aspa_update_operation *)0x0;
        current < (aspa_update_operation *)(ulong)array_00->size;
        current = (aspa_update_operation *)((long)&current->index + 1)) {
      paVar4 = operations + (long)current;
      if (current < (aspa_update_operation *)(count - 1)) {
        local_88 = operations + (long)((long)&current->index + 1);
      }
      else {
        local_88 = (aspa_update_operation *)0x0;
      }
      if ((failed_operation != (aspa_update_operation *)0x0) && (paVar4 == failed_operation)) break;
      while( true ) {
        bVar6 = false;
        if (i < array_00->size) {
          paVar5 = aspa_array_get_record(array_00,i);
          bVar6 = paVar5->customer_asn < (paVar4->record).customer_asn;
        }
        if (!bVar6) break;
        i = i + 1;
      }
      paVar5 = aspa_array_get_record(array_00,i);
      bVar6 = false;
      if (paVar5 != (aspa_record *)0x0) {
        bVar6 = paVar5->customer_asn == (paVar4->record).customer_asn;
      }
      bVar7 = false;
      if (local_88 != (aspa_update_operation *)0x0) {
        bVar7 = (local_88->record).customer_asn == (paVar4->record).customer_asn;
      }
      if (paVar4->type == ASPA_ADD) {
        if (!bVar6) {
          pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
          aspa_table_local._4_4_ = ASPA_RECORD_NOT_FOUND;
          goto LAB_00114662;
        }
        if ((bVar7) && (local_88->type == ASPA_REMOVE)) {
          paVar4->is_no_op = true;
          local_88->is_no_op = true;
          current = (aspa_update_operation *)((long)&current->index + 1);
        }
        else {
          aVar2 = aspa_array_remove(array_00,i,true);
          if (aVar2 != ASPA_SUCCESS) {
            pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
            aspa_table_local._4_4_ = ASPA_RECORD_NOT_FOUND;
            goto LAB_00114662;
          }
          aspa_table_notify_clients(aspa_table,&paVar4->record,rtr_socket,ASPA_REMOVE);
        }
      }
      else if (paVar4->type == ASPA_REMOVE) {
        if (((bool)(bVar6 & bVar7)) && (local_88->type == ASPA_ADD)) {
          if (paVar5->provider_asns != (uint32_t *)0x0) {
            lrtr_free(paVar5->provider_asns);
          }
          paVar5->provider_asns = (paVar4->record).provider_asns;
          paVar5->provider_count = (paVar4->record).provider_count;
          current = (aspa_update_operation *)((long)&current->index + 1);
          aspa_table_notify_clients(aspa_table,&local_88->record,rtr_socket,ASPA_REMOVE);
        }
        else {
          if (bVar6) {
            pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
            aspa_table_local._4_4_ = ASPA_DUPLICATE_RECORD;
            goto LAB_00114662;
          }
          aVar2 = aspa_array_insert(array_00,i,&paVar4->record,false);
          if (aVar2 != ASPA_SUCCESS) {
            pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
            aspa_table_local._4_4_ = ASPA_ERROR;
            goto LAB_00114662;
          }
        }
        aspa_table_notify_clients(aspa_table,&paVar4->record,rtr_socket,ASPA_ADD);
        (paVar4->record).provider_count = 0;
        (paVar4->record).provider_asns = (uint32_t *)0x0;
      }
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    aspa_table_local._4_4_ = ASPA_SUCCESS;
  }
LAB_00114662:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return aspa_table_local._4_4_;
}

Assistant:

static enum aspa_status aspa_table_update_in_place_undo_internal(struct aspa_table *aspa_table,
								 struct rtr_socket *rtr_socket,
								 struct aspa_update_operation *operations, size_t count,
								 struct aspa_update_operation *failed_operation)
{
	// Fail hard in debug builds.
	assert(aspa_table);
	assert(rtr_socket);
	assert(operations);
	assert(count > 0);

	pthread_rwlock_wrlock(&aspa_table->lock);
	struct aspa_store_node **node = aspa_store_get_node(&aspa_table->store, rtr_socket);

	if (!node || !*node || !(*node)->aspa_array) {
		// Node/array is gone -- nothing we can undo
		pthread_rwlock_unlock(&aspa_table->lock);
		return ASPA_ERROR;
	}

	assert(node);
	assert(*node);
	assert((*node)->aspa_array);

	struct aspa_array *array = (*node)->aspa_array;
	size_t existing_i = 0;

	for (size_t i = 0; i < array->size; i++) {
		struct aspa_update_operation *current = &operations[i];
		struct aspa_update_operation *next = (i < count - 1) ? &(operations[i + 1]) : NULL;

		// Check if this operation and the following were executed in the first place
		if (failed_operation && current == failed_operation)
			break;

		while (existing_i < array->size &&
		       aspa_array_get_record(array, existing_i)->customer_asn < current->record.customer_asn) {
			existing_i += 1;
		}

		struct aspa_record *existing_record = aspa_array_get_record(array, existing_i);

		// existing record and current op have matching CAS
		bool existing_matches_current = existing_record &&
						existing_record->customer_asn == current->record.customer_asn;

		// next record and current op have matching CAS
		bool next_matches_current = next && next->record.customer_asn == current->record.customer_asn;

		// MARK: Undo 'add' operation
		if (current->type == ASPA_ADD) {
			// Attempt to remove record with $CAS, but record with $CAS does not exist
			// Error: Removal of unknown record.
			if (!existing_matches_current) {
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_RECORD_NOT_FOUND;
			}

			// This operation adds a record with $CAS, the next op however removes this $CAS record again.
			if (next_matches_current && next->type == ASPA_REMOVE) {
#if ASPA_NOTIFY_NO_OPS
				// If it's a remove operation, we insert a reference to the removed record's providers.
				next->record = current->record;
				aspa_table_notify_clients(aspa_table, &next->record, rtr_socket, ASPA_ADD);
				aspa_table_notify_clients(aspa_table, &current->record, rtr_socket, ASPA_REMOVE);
#endif

				// Mark as no-op.
				current->is_no_op = true;
				next->is_no_op = true;

				// Skip next
				i += 1;
				continue;
			}

			// Remove record (release providers)
			if (aspa_array_remove(array, existing_i, true) != ASPA_SUCCESS) {
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_RECORD_NOT_FOUND;
			}

			aspa_table_notify_clients(aspa_table, &current->record, rtr_socket, ASPA_REMOVE);
		}

		// MARK: Undo 'remove' operation
		else if (current->type == ASPA_REMOVE) {
			// Next adds record with $CAS again.
			// Treat these two as a 'replace' op
			if (existing_matches_current & next_matches_current && next->type == ASPA_ADD) {
				if (existing_record->provider_asns)
					lrtr_free(existing_record->provider_asns);

				// If it's a remove operation, we inserted a reference to the existing
				// provider array. Put back reference.
				existing_record->provider_asns = current->record.provider_asns;
				existing_record->provider_count = current->record.provider_count;
				i += 1;

				aspa_table_notify_clients(aspa_table, &next->record, rtr_socket, ASPA_REMOVE);
			} else {
				// Attempt to add record with $CAS, but record with $CAS already exists
				// Error: Duplicate Add.
				if (existing_matches_current) {
					pthread_rwlock_unlock(&aspa_table->lock);
					return ASPA_DUPLICATE_RECORD;
				}

				// Insert record (don't copy providers)
				if (aspa_array_insert(array, existing_i, &current->record, false) != ASPA_SUCCESS) {
					pthread_rwlock_unlock(&aspa_table->lock);
					return ASPA_ERROR;
				}
			}

			aspa_table_notify_clients(aspa_table, &current->record, rtr_socket, ASPA_ADD);

			// If it's a remove operation, we inserted a reference to the existing
			// provider array. Restore that 'remove' operation back to its original state.
			current->record.provider_count = 0;
			current->record.provider_asns = NULL;
		}
	}

	pthread_rwlock_unlock(&aspa_table->lock);
	return ASPA_SUCCESS;
}